

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ElementSelectExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElementSelectExpressionSyntax,slang::syntax::ElementSelectExpressionSyntax_const&>
          (BumpAllocator *this,ElementSelectExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ExpressionSyntax *pEVar3;
  undefined4 uVar4;
  ElementSelectExpressionSyntax *pEVar5;
  
  pEVar5 = (ElementSelectExpressionSyntax *)allocate(this,0x28,8);
  uVar4 = *(undefined4 *)&(args->super_ExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ExpressionSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ExpressionSyntax).super_SyntaxNode.previewNode;
  pEVar3 = (args->left).ptr;
  (pEVar5->super_ExpressionSyntax).super_SyntaxNode.kind =
       (args->super_ExpressionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar5->super_ExpressionSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pEVar5->super_ExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  (pEVar5->super_ExpressionSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pEVar5->left).ptr = pEVar3;
  (pEVar5->select).ptr = (args->select).ptr;
  return pEVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }